

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  Mat *in_RDX;
  Mat *in_RSI;
  bool bVar2;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  Allocator *_allocator;
  Allocator *_allocator_00;
  int in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff0fc;
  undefined4 in_stack_fffffffffffff100;
  int in_stack_fffffffffffff104;
  Mat *in_stack_fffffffffffff108;
  void **ppvVar3;
  Mat *in_stack_fffffffffffff110;
  Allocator *in_stack_fffffffffffff160;
  int *in_stack_fffffffffffff1d0;
  Mat *pMVar4;
  int *in_stack_fffffffffffff1d8;
  Mat *pMVar5;
  int *in_stack_fffffffffffff1e0;
  int *in_stack_fffffffffffff1e8;
  Mat *in_stack_fffffffffffff1f0;
  Crop *in_stack_fffffffffffff1f8;
  int *in_stack_fffffffffffff240;
  int *in_stack_fffffffffffff248;
  int *in_stack_fffffffffffff250;
  int *in_stack_fffffffffffff258;
  undefined8 local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined4 local_c80;
  Allocator *local_c78;
  undefined4 local_c70;
  undefined4 local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined8 local_c58;
  void *local_c50;
  int *local_c48;
  size_t local_c40;
  int local_c38;
  Allocator *local_c30;
  undefined4 local_c28;
  int local_c24;
  int local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  long local_c10;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined4 local_bf0;
  Allocator *local_be8;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined8 local_bc8;
  void *local_bc0;
  int *local_bb8;
  ulong local_bb0;
  int local_ba8;
  Allocator *local_ba0;
  undefined4 local_b98;
  int local_b94;
  int local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  long local_b80;
  int local_b78;
  int local_b74;
  Mat local_b70;
  void *local_b28;
  int *local_b20;
  ulong local_b18;
  int local_b10;
  Allocator *local_b08;
  int local_b00;
  int local_afc;
  int local_af8;
  uint local_af4;
  int local_af0;
  ulong local_ae8;
  void *local_ae0;
  int *local_ad8;
  ulong local_ad0;
  int local_ac8;
  Allocator *local_ac0;
  int local_ab8;
  int local_ab4;
  int local_ab0;
  undefined4 local_aac;
  int local_aa8;
  ulong local_aa0;
  void *local_a98;
  int *local_a90;
  ulong local_a88;
  int local_a80;
  Allocator *local_a78;
  int local_a70;
  int local_a6c;
  int local_a68;
  undefined4 local_a64;
  uint local_a60;
  ulong local_a58;
  int local_a50;
  undefined4 local_a4c;
  Mat local_a48;
  void *local_a00;
  int *local_9f8;
  ulong local_9f0;
  int local_9e8;
  Allocator *local_9e0;
  int local_9d8;
  int local_9d4;
  int local_9d0;
  uint local_9cc;
  int local_9c8;
  ulong local_9c0;
  void *local_9a8;
  int *local_9a0;
  undefined8 local_998;
  undefined4 local_990;
  long *local_988;
  undefined4 local_980;
  int local_97c;
  int local_978;
  int local_974;
  int local_970;
  ulong local_968;
  undefined1 local_960 [8];
  int local_958;
  int local_954;
  int local_950;
  int local_94c;
  size_t local_940;
  int local_934;
  int local_930;
  int local_92c;
  int local_928;
  int local_924;
  Mat *local_918;
  Mat *local_910;
  int local_8fc;
  void **local_8f8;
  Mat *local_8e8;
  void **local_8d8;
  void **local_8c8;
  void **local_8b8;
  Mat *local_8a8;
  undefined8 *local_898;
  undefined8 *local_888;
  void **local_878;
  void **local_868;
  void **local_858;
  int local_848;
  undefined4 local_844;
  Mat *local_840;
  Mat *local_838;
  int local_828;
  undefined4 local_824;
  Mat *local_820;
  Mat *local_818;
  int local_808;
  undefined4 local_804;
  Mat *local_800;
  Mat *local_7f8;
  int local_7e8;
  undefined4 local_7e4;
  Mat *local_7e0;
  Mat *local_7d8;
  int local_7c8;
  undefined4 local_7c4;
  Mat *local_7c0;
  Mat *local_7b8;
  int local_7a8;
  undefined4 local_7a4;
  Mat *local_7a0;
  Mat *local_798;
  Mat *local_788;
  Mat *local_780;
  Mat *local_778;
  Mat *local_770;
  Mat *local_768;
  Mat *local_760;
  void **local_750;
  void **local_748;
  undefined1 local_739;
  void **local_728;
  undefined1 local_711;
  void **local_700;
  undefined1 local_6ed;
  int local_6ec;
  void **local_6e8;
  undefined8 *local_6e0;
  undefined1 local_6cd;
  int local_6cc;
  void **local_6c8;
  void **local_6c0;
  undefined1 local_6ad;
  int local_6ac;
  undefined8 *local_6a0;
  undefined1 local_68d;
  int local_68c;
  void **local_680;
  int local_66c;
  undefined8 *local_668;
  void **local_660;
  int local_654;
  undefined8 *local_650;
  void **local_648;
  int local_5e0;
  undefined4 local_5dc;
  Mat *local_5d8;
  int local_5d0;
  undefined4 local_5cc;
  Mat *local_5c8;
  int local_5c0;
  undefined4 local_5bc;
  Mat *local_5b8;
  int local_5b0;
  undefined4 local_5ac;
  Mat *local_5a8;
  int local_5a0;
  undefined4 local_59c;
  Mat *local_598;
  int local_590;
  undefined4 local_58c;
  Mat *local_588;
  int local_570;
  undefined4 local_56c;
  void **local_568;
  int local_550;
  undefined4 local_54c;
  void **local_548;
  int local_530;
  undefined4 local_52c;
  void **local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  Mat *local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  void **local_4a8;
  int local_490;
  undefined4 local_48c;
  void **local_488;
  int local_470;
  undefined4 local_46c;
  void **local_468;
  int local_450;
  undefined4 local_44c;
  Mat *local_448;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  void *local_420;
  void *local_400;
  void *local_3f0;
  void *local_3e0;
  void *local_3a0;
  void *local_390;
  void *local_380;
  void *local_370;
  void *local_368;
  void *local_360;
  void *local_358;
  void *local_350;
  void *local_348;
  Mat *local_310;
  Mat *local_308;
  Mat *local_300;
  Mat *local_2f8;
  Mat *local_2f0;
  Mat *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  int local_2c4;
  void **local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  int local_2a0;
  int local_29c;
  void **local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  int local_274;
  int local_270;
  int local_26c;
  void **local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  void **local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  Allocator *local_210;
  int local_204;
  ulong local_200;
  void *local_1f8;
  uint local_1ec;
  int local_1e8;
  int local_1e4;
  void **local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  ulong local_1b8;
  void *local_1b0;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  void **local_198;
  undefined4 local_18c;
  long local_188;
  Allocator *local_180;
  int local_174;
  ulong local_170;
  void *local_168;
  int local_15c;
  int local_158;
  int local_154;
  void **local_150;
  undefined4 local_144;
  long local_140;
  Allocator *local_138;
  int local_12c;
  size_t local_128;
  void *local_120;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  long local_f8;
  Allocator *local_f0;
  int local_e4;
  ulong local_e0;
  void *local_d8;
  uint local_cc;
  int local_c8;
  int local_c4;
  void **local_c0;
  undefined4 local_b4;
  long local_b0;
  Allocator *local_a8;
  int local_9c;
  ulong local_98;
  void *local_90;
  uint local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  void **local_38;
  Allocator *local_30;
  int local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_924 = in_RSI->w;
  local_928 = in_RSI->h;
  local_92c = in_RSI->d;
  local_930 = in_RSI->c;
  local_934 = in_RSI->dims;
  local_940 = in_RSI->elemsize;
  local_954 = -1;
  local_958 = -1;
  local_960._4_4_ = -1;
  local_750 = &local_9a8;
  if (in_RSI->dims == 1) {
    local_2c4 = in_RSI->w * in_RSI->elempack;
    local_2c0 = &local_9a8;
    local_2d0 = 0;
    local_2d8 = 4;
    local_2e0 = 0;
    local_998 = 4;
    local_990 = 1;
    local_980 = 1;
    local_978 = 1;
    local_974 = 1;
    local_970 = 1;
    local_968 = (ulong)local_2c4;
    local_97c = local_2c4;
  }
  else if (in_RSI->dims == 2) {
    local_29c = in_RSI->w;
    local_2a0 = in_RSI->h * in_RSI->elempack;
    local_298 = &local_9a8;
    local_2a8 = 0;
    local_2b0 = 4;
    local_2b8 = 0;
    local_998 = 4;
    local_990 = 1;
    local_980 = 2;
    local_974 = 1;
    local_970 = 1;
    local_968 = (long)local_29c * (long)local_2a0;
    local_97c = local_29c;
    local_978 = local_2a0;
  }
  else if (in_RSI->dims == 3) {
    local_26c = in_RSI->w;
    local_270 = in_RSI->h;
    local_274 = in_RSI->c * in_RSI->elempack;
    local_268 = &local_9a8;
    local_280 = 0;
    local_288 = 4;
    local_290 = 0;
    local_998 = 4;
    local_990 = 1;
    local_980 = 3;
    local_974 = 1;
    local_218 = (long)local_26c * (long)local_270 * 4;
    local_21c = 0x10;
    local_968 = (local_218 + 0xfU & 0xfffffffffffffff0) / 4;
    local_97c = local_26c;
    local_978 = local_270;
    local_970 = local_274;
  }
  else if (in_RSI->dims == 4) {
    local_23c = in_RSI->w;
    local_240 = in_RSI->h;
    local_244 = in_RSI->d;
    local_248 = in_RSI->c * in_RSI->elempack;
    local_238 = &local_9a8;
    local_250 = 0;
    local_258 = 4;
    local_260 = 0;
    local_998 = 4;
    local_990 = 1;
    local_980 = 4;
    local_228 = (long)local_23c * (long)local_240 * (long)local_244 * 4;
    local_22c = 0x10;
    local_968 = (local_228 + 0xfU & 0xfffffffffffffff0) / 4;
    local_97c = local_23c;
    local_978 = local_240;
    local_974 = local_244;
    local_970 = local_248;
  }
  else {
    local_748 = &local_9a8;
    local_998 = 0;
    local_990 = 0;
    local_980 = 0;
    local_97c = 0;
    local_978 = 0;
    local_974 = 0;
    local_970 = 0;
    local_968 = 0;
  }
  local_988 = (long *)0x0;
  local_9a0 = (int *)0x0;
  local_9a8 = (void *)0x0;
  _allocator_00 = (Allocator *)local_960;
  _allocator = (Allocator *)(local_960 + 4);
  local_918 = in_RDX;
  local_910 = in_RSI;
  resolve_crop_roi(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,
                   in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
                   in_stack_fffffffffffff240,in_stack_fffffffffffff248,in_stack_fffffffffffff250,
                   in_stack_fffffffffffff258);
  local_8f8 = &local_9a8;
  local_428 = local_8f8;
  if (local_9a0 != (int *)0x0) {
    local_42c = 0xffffffff;
    LOCK();
    local_430 = *local_9a0;
    *local_9a0 = *local_9a0 + -1;
    UNLOCK();
    if (local_430 == 1) {
      if (local_988 == (long *)0x0) {
        local_420 = local_9a8;
        if (local_9a8 != (void *)0x0) {
          free(local_9a8);
        }
      }
      else {
        (**(code **)(*local_988 + 0x18))(local_988,local_9a8);
      }
    }
  }
  local_9a8 = (void *)0x0;
  local_998 = 0;
  local_990 = 0;
  local_980 = 0;
  local_97c = 0;
  local_978 = 0;
  local_974 = 0;
  local_970 = 0;
  local_968 = 0;
  local_9a0 = (int *)0x0;
  if (local_934 == 1) {
    if (local_954 == local_924) {
      local_798 = local_918;
      local_7a0 = local_910;
      if (local_918 != local_910) {
        if (local_910->refcount != (int *)0x0) {
          piVar1 = local_910->refcount;
          local_7a4 = 1;
          LOCK();
          local_7a8 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5d8 = local_918;
        if (local_918->refcount != (int *)0x0) {
          piVar1 = local_918->refcount;
          local_5dc = 0xffffffff;
          LOCK();
          local_5e0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5e0 == 1) {
            if (local_918->allocator == (Allocator *)0x0) {
              local_348 = local_918->data;
              if (local_348 != (void *)0x0) {
                free(local_348);
              }
            }
            else {
              (*local_918->allocator->_vptr_Allocator[3])(local_918->allocator,local_918->data);
            }
          }
        }
        local_918->data = (void *)0x0;
        local_918->elemsize = 0;
        local_918->elempack = 0;
        local_918->dims = 0;
        local_918->w = 0;
        local_918->h = 0;
        local_918->d = 0;
        local_918->c = 0;
        local_918->cstep = 0;
        local_918->refcount = (int *)0x0;
        local_918->data = local_7a0->data;
        local_918->refcount = local_7a0->refcount;
        local_918->elemsize = local_7a0->elemsize;
        local_918->elempack = local_7a0->elempack;
        local_918->allocator = local_7a0->allocator;
        local_918->dims = local_7a0->dims;
        local_918->w = local_7a0->w;
        local_918->h = local_7a0->h;
        local_918->d = local_7a0->d;
        local_918->c = local_7a0->c;
        local_918->cstep = local_7a0->cstep;
      }
      local_8fc = 0;
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                  in_stack_fffffffffffff0fc,(size_t)_allocator_00,_allocator);
      local_760 = local_918;
      bVar2 = true;
      if (local_918->data != (void *)0x0) {
        local_310 = local_918;
        bVar2 = local_918->cstep * (long)local_918->c == 0;
      }
      if (bVar2) {
        local_8fc = -100;
      }
      else {
        if (local_940 == 1) {
          copy_cut_border_image<signed_char>
                    (in_stack_fffffffffffff108,
                     (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                     in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
        }
        if (local_940 == 2) {
          copy_cut_border_image<unsigned_short>
                    (in_stack_fffffffffffff108,
                     (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                     in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
        }
        if (local_940 == 4) {
          copy_cut_border_image<float>
                    (in_stack_fffffffffffff108,
                     (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                     in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
        }
        local_8fc = 0;
      }
    }
  }
  else if (local_934 == 2) {
    if ((local_954 == local_924) && (local_958 == local_928)) {
      local_7b8 = local_918;
      local_7c0 = local_910;
      if (local_918 != local_910) {
        if (local_910->refcount != (int *)0x0) {
          piVar1 = local_910->refcount;
          local_7c4 = 1;
          LOCK();
          local_7c8 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5c8 = local_918;
        if (local_918->refcount != (int *)0x0) {
          piVar1 = local_918->refcount;
          local_5cc = 0xffffffff;
          LOCK();
          local_5d0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5d0 == 1) {
            if (local_918->allocator == (Allocator *)0x0) {
              local_350 = local_918->data;
              if (local_350 != (void *)0x0) {
                free(local_350);
              }
            }
            else {
              (*local_918->allocator->_vptr_Allocator[3])(local_918->allocator,local_918->data);
            }
          }
        }
        local_918->data = (void *)0x0;
        local_918->elemsize = 0;
        local_918->elempack = 0;
        local_918->dims = 0;
        local_918->w = 0;
        local_918->h = 0;
        local_918->d = 0;
        local_918->c = 0;
        local_918->cstep = 0;
        local_918->refcount = (int *)0x0;
        local_918->data = local_7c0->data;
        local_918->refcount = local_7c0->refcount;
        local_918->elemsize = local_7c0->elemsize;
        local_918->elempack = local_7c0->elempack;
        local_918->allocator = local_7c0->allocator;
        local_918->dims = local_7c0->dims;
        local_918->w = local_7c0->w;
        local_918->h = local_7c0->h;
        local_918->d = local_7c0->d;
        local_918->c = local_7c0->c;
        local_918->cstep = local_7c0->cstep;
      }
      local_8fc = 0;
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                  in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8,(size_t)_allocator_00,
                  _allocator);
      local_768 = local_918;
      bVar2 = true;
      if (local_918->data != (void *)0x0) {
        local_308 = local_918;
        bVar2 = local_918->cstep * (long)local_918->c == 0;
      }
      if (bVar2) {
        local_8fc = -100;
      }
      else {
        if (local_940 == 1) {
          copy_cut_border_image<signed_char>
                    (in_stack_fffffffffffff108,
                     (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                     in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
        }
        if (local_940 == 2) {
          copy_cut_border_image<unsigned_short>
                    (in_stack_fffffffffffff108,
                     (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                     in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
        }
        if (local_940 == 4) {
          copy_cut_border_image<float>
                    (in_stack_fffffffffffff108,
                     (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                     in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
        }
        local_8fc = 0;
      }
    }
  }
  else if (local_934 == 3) {
    if (((local_954 == local_924) && (local_958 == local_928)) && (local_960._0_4_ == local_930)) {
      local_7d8 = local_918;
      local_7e0 = local_910;
      if (local_918 != local_910) {
        if (local_910->refcount != (int *)0x0) {
          piVar1 = local_910->refcount;
          local_7e4 = 1;
          LOCK();
          local_7e8 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5b8 = local_918;
        if (local_918->refcount != (int *)0x0) {
          piVar1 = local_918->refcount;
          local_5bc = 0xffffffff;
          LOCK();
          local_5c0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5c0 == 1) {
            if (local_918->allocator == (Allocator *)0x0) {
              local_358 = local_918->data;
              if (local_358 != (void *)0x0) {
                free(local_358);
              }
            }
            else {
              (*local_918->allocator->_vptr_Allocator[3])(local_918->allocator,local_918->data);
            }
          }
        }
        local_918->data = (void *)0x0;
        local_918->elemsize = 0;
        local_918->elempack = 0;
        local_918->dims = 0;
        local_918->w = 0;
        local_918->h = 0;
        local_918->d = 0;
        local_918->c = 0;
        local_918->cstep = 0;
        local_918->refcount = (int *)0x0;
        local_918->data = local_7e0->data;
        local_918->refcount = local_7e0->refcount;
        local_918->elemsize = local_7e0->elemsize;
        local_918->elempack = local_7e0->elempack;
        local_918->allocator = local_7e0->allocator;
        local_918->dims = local_7e0->dims;
        local_918->w = local_7e0->w;
        local_918->h = local_7e0->h;
        local_918->d = local_7e0->d;
        local_918->c = local_7e0->c;
        local_918->cstep = local_7e0->cstep;
      }
      local_8fc = 0;
    }
    else {
      local_700 = &local_a00;
      local_1e4 = local_910->w;
      local_1e8 = local_910->h;
      local_1ec = local_910->d;
      local_1f8 = (void *)((long)local_910->data +
                          local_910->cstep * (long)local_950 * local_910->elemsize);
      local_200 = local_910->elemsize;
      local_204 = local_910->elempack;
      local_210 = local_910->allocator;
      local_1e0 = &local_a00;
      local_9f8 = (int *)0x0;
      local_9c8 = local_960._0_4_;
      local_1d0 = (long)local_1e4 * (long)local_1e8 * (long)(int)local_1ec * local_200;
      local_9c0 = (local_1d0 + 0xfU & 0xfffffffffffffff0) / local_200;
      local_9d8 = local_910->dims;
      local_1d4 = 0x10;
      local_711 = 1;
      local_a00 = local_1f8;
      local_9f0 = local_200;
      local_9e8 = local_204;
      local_9e0 = local_210;
      local_9d4 = local_1e4;
      local_9d0 = local_1e8;
      local_9cc = local_1ec;
      if ((local_954 == local_924) && (local_958 == local_928)) {
        Mat::clone(&local_a48,(__fn *)&local_a00,(void *)0x0,(int)local_1e0,(void *)(ulong)local_1ec
                  );
        pMVar4 = local_918;
        local_7f8 = local_918;
        local_800 = &local_a48;
        if (local_918 != local_800) {
          if (local_a48.refcount != (int *)0x0) {
            local_804 = 1;
            LOCK();
            local_808 = *local_a48.refcount;
            *local_a48.refcount = *local_a48.refcount + 1;
            UNLOCK();
          }
          local_5a8 = local_918;
          if (local_918->refcount != (int *)0x0) {
            piVar1 = local_918->refcount;
            local_5ac = 0xffffffff;
            LOCK();
            local_5b0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_5b0 == 1) {
              if (local_918->allocator == (Allocator *)0x0) {
                local_360 = local_918->data;
                if (local_360 != (void *)0x0) {
                  free(local_360);
                }
              }
              else {
                (*local_918->allocator->_vptr_Allocator[3])(local_918->allocator,local_918->data);
              }
            }
          }
          pMVar4->data = (void *)0x0;
          pMVar4->elemsize = 0;
          pMVar4->elempack = 0;
          pMVar4->dims = 0;
          pMVar4->w = 0;
          pMVar4->h = 0;
          pMVar4->d = 0;
          pMVar4->c = 0;
          pMVar4->cstep = 0;
          pMVar4->refcount = (int *)0x0;
          pMVar4->data = local_800->data;
          pMVar4->refcount = local_800->refcount;
          pMVar4->elemsize = local_800->elemsize;
          pMVar4->elempack = local_800->elempack;
          pMVar4->allocator = local_800->allocator;
          pMVar4->dims = local_800->dims;
          pMVar4->w = local_800->w;
          pMVar4->h = local_800->h;
          pMVar4->d = local_800->d;
          pMVar4->c = local_800->c;
          pMVar4->cstep = local_800->cstep;
        }
        local_8e8 = &local_a48;
        local_448 = local_8e8;
        if (local_a48.refcount != (int *)0x0) {
          local_44c = 0xffffffff;
          LOCK();
          local_450 = *local_a48.refcount;
          *local_a48.refcount = *local_a48.refcount + -1;
          UNLOCK();
          if (local_450 == 1) {
            if (local_a48.allocator == (Allocator *)0x0) {
              if (local_a48.data != (void *)0x0) {
                free(local_a48.data);
              }
            }
            else {
              (*(local_a48.allocator)->_vptr_Allocator[3])(local_a48.allocator,local_a48.data);
            }
          }
        }
        local_a48.data = (void *)0x0;
        local_a48.elemsize = 0;
        local_a48.elempack = 0;
        local_a48.dims = 0;
        local_a48.w = 0;
        local_a48.h = 0;
        local_a48.d = 0;
        local_a48.c = 0;
        local_a48.cstep = 0;
        local_a48.refcount = (int *)0x0;
        local_770 = local_918;
        bVar2 = true;
        if (local_918->data != (void *)0x0) {
          local_300 = local_918;
          bVar2 = local_918->cstep * (long)local_918->c == 0;
        }
        if (bVar2) {
          local_8fc = -100;
        }
        else {
          local_8fc = 0;
        }
      }
      else {
        Mat::create(in_stack_fffffffffffff110,(int)((ulong)in_stack_fffffffffffff108 >> 0x20),
                    (int)in_stack_fffffffffffff108,in_stack_fffffffffffff104,
                    CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8),_allocator_00);
        local_778 = local_918;
        bVar2 = true;
        if (local_918->data != (void *)0x0) {
          local_2f8 = local_918;
          bVar2 = local_918->cstep * (long)local_918->c == 0;
        }
        if (bVar2) {
          local_8fc = -100;
        }
        else {
          for (local_a50 = 0; local_a50 < (int)local_960._0_4_; local_a50 = local_a50 + 1) {
            local_6c0 = &local_a98;
            local_6c8 = &local_a00;
            local_d8 = (void *)((long)local_a00 + local_9c0 * (long)local_a50 * local_9f0);
            local_c0 = &local_a98;
            local_a90 = (int *)0x0;
            local_a88 = local_9f0;
            local_a80 = local_9e8;
            local_a78 = local_9e0;
            local_a6c = local_9d4;
            local_a68 = local_9d0;
            local_a64 = 1;
            local_a60 = local_9cc;
            local_b0 = (long)local_9d4 * (long)local_9d0 * local_9f0;
            local_a58 = (local_b0 + 0xfU & 0xfffffffffffffff0) / local_9f0;
            local_a70 = local_9d8 + -1;
            if (local_9d8 == 4) {
              local_a58 = (long)local_9d4 * (long)local_9d0;
            }
            local_680 = &local_ae0;
            local_154 = local_918->w;
            local_158 = local_918->h;
            local_15c = local_918->d;
            local_168 = (void *)((long)local_918->data +
                                local_918->cstep * (long)local_a50 * local_918->elemsize);
            local_170 = local_918->elemsize;
            local_174 = local_918->elempack;
            local_180 = local_918->allocator;
            local_150 = &local_ae0;
            local_ad8 = (int *)0x0;
            local_aac = 1;
            local_140 = (long)local_154 * (long)local_158 * local_170;
            local_aa0 = (local_140 + 0xfU & 0xfffffffffffffff0) / local_170;
            local_ab8 = local_918->dims + -1;
            if (local_918->dims == 4) {
              local_aa0 = (long)local_918->w * (long)local_918->h;
            }
            local_b4 = 0x10;
            local_c4 = local_9d4;
            local_c8 = local_9d0;
            local_cc = local_9cc;
            local_e0 = local_9f0;
            local_e4 = local_9e8;
            local_f0 = local_9e0;
            local_144 = 0x10;
            local_68c = local_a50;
            local_68d = 1;
            local_6cc = local_a50;
            local_6cd = 1;
            local_ae0 = local_168;
            local_ad0 = local_170;
            local_ac8 = local_174;
            local_ac0 = local_180;
            local_ab4 = local_154;
            local_ab0 = local_158;
            local_aa8 = local_15c;
            local_a98 = local_d8;
            if (local_940 == 1) {
              copy_cut_border_image<signed_char>
                        (in_stack_fffffffffffff108,
                         (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                         in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
            }
            if (local_940 == 2) {
              copy_cut_border_image<unsigned_short>
                        (in_stack_fffffffffffff108,
                         (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                         in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
            }
            if (local_940 == 4) {
              copy_cut_border_image<float>
                        (in_stack_fffffffffffff108,
                         (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                         in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
            }
            local_8d8 = &local_ae0;
            local_468 = local_8d8;
            if (local_ad8 != (int *)0x0) {
              local_46c = 0xffffffff;
              LOCK();
              local_470 = *local_ad8;
              *local_ad8 = *local_ad8 + -1;
              UNLOCK();
              if (local_470 == 1) {
                if (local_ac0 == (Allocator *)0x0) {
                  local_400 = local_ae0;
                  if (local_ae0 != (void *)0x0) {
                    free(local_ae0);
                  }
                }
                else {
                  (*local_ac0->_vptr_Allocator[3])(local_ac0,local_ae0);
                }
              }
            }
            local_ae0 = (void *)0x0;
            local_ad0 = 0;
            local_ac8 = 0;
            local_ab8 = 0;
            local_ab4 = 0;
            local_ab0 = 0;
            local_aac = 0;
            local_aa8 = 0;
            local_aa0 = 0;
            local_ad8 = (int *)0x0;
            local_8c8 = &local_a98;
            local_488 = local_8c8;
            if (local_a90 != (int *)0x0) {
              local_48c = 0xffffffff;
              LOCK();
              local_490 = *local_a90;
              *local_a90 = *local_a90 + -1;
              UNLOCK();
              if (local_490 == 1) {
                if (local_a78 == (Allocator *)0x0) {
                  local_3f0 = local_a98;
                  if (local_a98 != (void *)0x0) {
                    free(local_a98);
                  }
                }
                else {
                  (*local_a78->_vptr_Allocator[3])(local_a78,local_a98);
                }
              }
            }
            local_a98 = (void *)0x0;
            local_a88 = 0;
            local_a80 = 0;
            local_a70 = 0;
            local_a6c = 0;
            local_a68 = 0;
            local_a64 = 0;
            local_a60 = 0;
            local_a58 = 0;
            local_a90 = (int *)0x0;
          }
          local_8fc = 0;
        }
      }
      local_a4c = 1;
      local_8b8 = &local_a00;
      if (local_9f8 != (int *)0x0) {
        local_4ac = 0xffffffff;
        LOCK();
        local_4b0 = *local_9f8;
        *local_9f8 = *local_9f8 + -1;
        UNLOCK();
        if (local_4b0 == 1) {
          local_4a8 = local_8b8;
          if (local_9e0 == (Allocator *)0x0) {
            local_3e0 = local_a00;
            if (local_a00 != (void *)0x0) {
              free(local_a00);
            }
          }
          else {
            (*local_9e0->_vptr_Allocator[3])(local_9e0,local_a00);
          }
        }
      }
    }
  }
  else if (local_934 == 4) {
    if ((((local_954 == local_924) && (local_958 == local_928)) && (local_960._4_4_ == local_92c))
       && (local_960._0_4_ == local_930)) {
      local_818 = local_918;
      local_820 = local_910;
      if (local_918 != local_910) {
        if (local_910->refcount != (int *)0x0) {
          piVar1 = local_910->refcount;
          local_824 = 1;
          LOCK();
          local_828 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_598 = local_918;
        pMVar4 = local_918;
        if (local_918->refcount != (int *)0x0) {
          piVar1 = local_918->refcount;
          local_59c = 0xffffffff;
          LOCK();
          local_5a0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5a0 == 1) {
            if (local_918->allocator == (Allocator *)0x0) {
              local_368 = local_918->data;
              if (local_368 != (void *)0x0) {
                free(local_368);
              }
            }
            else {
              (*local_918->allocator->_vptr_Allocator[3])(local_918->allocator,local_918->data);
            }
          }
        }
        pMVar4->data = (void *)0x0;
        pMVar4->elemsize = 0;
        pMVar4->elempack = 0;
        pMVar4->dims = 0;
        pMVar4->w = 0;
        pMVar4->h = 0;
        pMVar4->d = 0;
        pMVar4->c = 0;
        pMVar4->cstep = 0;
        pMVar4->refcount = (int *)0x0;
        local_918->data = local_820->data;
        local_918->refcount = local_820->refcount;
        local_918->elemsize = local_820->elemsize;
        local_918->elempack = local_820->elempack;
        local_918->allocator = local_820->allocator;
        local_918->dims = local_820->dims;
        local_918->w = local_820->w;
        local_918->h = local_820->h;
        local_918->d = local_820->d;
        local_918->c = local_820->c;
        local_918->cstep = local_820->cstep;
      }
      local_8fc = 0;
    }
    else {
      local_728 = &local_b28;
      local_19c = local_910->w;
      local_1a0 = local_910->h;
      local_1a4 = local_910->d;
      local_1b0 = (void *)((long)local_910->data +
                          local_910->cstep * (long)local_950 * local_910->elemsize);
      local_1b8 = local_910->elemsize;
      local_1bc = local_910->elempack;
      local_1c8 = local_910->allocator;
      local_198 = &local_b28;
      local_b20 = (int *)0x0;
      local_af0 = local_960._0_4_;
      local_188 = (long)local_19c * (long)local_1a0 * (long)(int)local_1a4 * local_1b8;
      local_ae8 = (local_188 + 0xfU & 0xfffffffffffffff0) / local_1b8;
      local_b00 = local_910->dims;
      local_18c = 0x10;
      local_739 = 1;
      local_b28 = local_1b0;
      local_b18 = local_1b8;
      local_b10 = local_1bc;
      local_b08 = local_1c8;
      local_afc = local_19c;
      local_af8 = local_1a0;
      local_af4 = local_1a4;
      if (((local_954 == local_924) && (local_958 == local_928)) && (local_960._4_4_ == local_92c))
      {
        Mat::clone(&local_b70,(__fn *)&local_b28,(void *)0x0,(int)local_198,(void *)(ulong)local_1a4
                  );
        local_838 = local_918;
        local_840 = &local_b70;
        if (local_918 != local_840) {
          if (local_b70.refcount != (int *)0x0) {
            local_844 = 1;
            LOCK();
            local_848 = *local_b70.refcount;
            *local_b70.refcount = *local_b70.refcount + 1;
            UNLOCK();
          }
          local_588 = local_918;
          pMVar4 = local_918;
          pMVar5 = local_918;
          if (local_918->refcount != (int *)0x0) {
            piVar1 = local_918->refcount;
            local_58c = 0xffffffff;
            LOCK();
            local_590 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_590 == 1) {
              if (local_918->allocator == (Allocator *)0x0) {
                local_370 = local_918->data;
                if (local_370 != (void *)0x0) {
                  free(local_370);
                }
              }
              else {
                (*local_918->allocator->_vptr_Allocator[3])(local_918->allocator,local_918->data);
              }
            }
          }
          pMVar4->data = (void *)0x0;
          pMVar4->elemsize = 0;
          pMVar4->elempack = 0;
          pMVar4->dims = 0;
          pMVar4->w = 0;
          pMVar4->h = 0;
          pMVar4->d = 0;
          pMVar4->c = 0;
          pMVar4->cstep = 0;
          pMVar4->refcount = (int *)0x0;
          pMVar5->data = local_840->data;
          pMVar5->refcount = local_840->refcount;
          pMVar5->elemsize = local_840->elemsize;
          pMVar5->elempack = local_840->elempack;
          pMVar5->allocator = local_840->allocator;
          pMVar5->dims = local_840->dims;
          pMVar5->w = local_840->w;
          pMVar5->h = local_840->h;
          pMVar5->d = local_840->d;
          pMVar5->c = local_840->c;
          pMVar5->cstep = local_840->cstep;
        }
        local_8a8 = &local_b70;
        local_4c8 = local_8a8;
        if (local_b70.refcount != (int *)0x0) {
          local_4cc = 0xffffffff;
          LOCK();
          local_4d0 = *local_b70.refcount;
          *local_b70.refcount = *local_b70.refcount + -1;
          UNLOCK();
          if (local_4d0 == 1) {
            if (local_b70.allocator == (Allocator *)0x0) {
              if (local_b70.data != (void *)0x0) {
                free(local_b70.data);
              }
            }
            else {
              (*(local_b70.allocator)->_vptr_Allocator[3])(local_b70.allocator,local_b70.data);
            }
          }
        }
        local_b70.data = (void *)0x0;
        local_b70.elemsize = 0;
        local_b70.elempack = 0;
        local_b70.dims = 0;
        local_b70.w = 0;
        local_b70.h = 0;
        local_b70.d = 0;
        local_b70.c = 0;
        local_b70.cstep = 0;
        local_b70.refcount = (int *)0x0;
        local_780 = local_918;
        bVar2 = true;
        if (local_918->data != (void *)0x0) {
          local_2f0 = local_918;
          bVar2 = local_918->cstep * (long)local_918->c == 0;
        }
        if (bVar2) {
          local_8fc = -100;
        }
        else {
          local_8fc = 0;
        }
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                    in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8,
                    (int)((ulong)_allocator_00 >> 0x20),(int)_allocator_00,(size_t)_allocator,
                    in_stack_fffffffffffff160);
        local_788 = local_918;
        bVar2 = true;
        if (local_918->data != (void *)0x0) {
          local_2e8 = local_918;
          bVar2 = local_918->cstep * (long)local_918->c == 0;
        }
        if (bVar2) {
          local_8fc = -100;
        }
        else {
          for (local_b74 = 0; local_b74 < (int)local_960._0_4_; local_b74 = local_b74 + 1) {
            for (local_b78 = 0; local_b78 < (int)local_960._4_4_; local_b78 = local_b78 + 1) {
              local_6e0 = &local_c08;
              local_6e8 = &local_b28;
              local_90 = (void *)((long)local_b28 + local_ae8 * (long)local_b74 * local_b18);
              local_78 = &local_c08;
              local_68 = (long)local_afc * (long)local_af8 * local_b18;
              local_66c = local_b78 + local_94c;
              local_660 = &local_bc0;
              local_668 = &local_c08;
              local_18 = (void *)((long)local_90 +
                                 (long)local_afc * (long)local_af8 * (long)local_66c * local_b18);
              local_8 = &local_bc0;
              local_b80 = (long)local_afc * (long)local_af8;
              local_898 = &local_c08;
              local_b88 = 1;
              local_b8c = 1;
              local_b90 = local_af8;
              local_b94 = local_afc;
              local_b98 = 2;
              local_ba0 = local_b08;
              local_ba8 = local_b10;
              local_bb0 = local_b18;
              local_bb8 = (int *)0x0;
              local_be8 = local_b08;
              local_c = local_afc;
              local_10 = local_af8;
              local_20 = local_b18;
              local_24 = local_b10;
              local_30 = local_b08;
              local_6c = 0x10;
              local_7c = local_afc;
              local_80 = local_af8;
              local_84 = local_af4;
              local_98 = local_b18;
              local_9c = local_b10;
              local_a8 = local_b08;
              local_6ec = local_b74;
              local_6ed = 1;
              local_c08 = 0;
              local_bf8 = 0;
              local_bf0 = 0;
              local_be0 = 0;
              local_bdc = 0;
              local_bd8 = 0;
              local_bd4 = 0;
              local_bd0 = 0;
              local_bc8 = 0;
              local_c00 = 0;
              local_6a0 = &local_c98;
              local_10c = local_918->w;
              local_110 = local_918->h;
              local_114 = local_918->d;
              local_120 = (void *)((long)local_918->data +
                                  local_918->cstep * (long)local_b74 * local_918->elemsize);
              local_128 = local_918->elemsize;
              local_12c = local_918->elempack;
              local_138 = local_918->allocator;
              local_108 = &local_c98;
              local_f8 = (long)local_10c * (long)local_110 * local_128;
              local_648 = &local_c50;
              local_650 = &local_c98;
              local_48 = (void *)((long)local_120 +
                                 (long)local_10c * (long)local_110 * (long)local_b78 * local_128);
              local_38 = &local_c50;
              local_c10 = (long)local_10c * (long)local_110;
              local_888 = &local_c98;
              local_c18 = 1;
              local_c1c = 1;
              local_c28 = 2;
              local_c48 = (int *)0x0;
              local_fc = 0x10;
              local_654 = local_b78;
              local_6ac = local_b74;
              local_6ad = 1;
              local_c98 = 0;
              local_c88 = 0;
              local_c80 = 0;
              local_c70 = 0;
              local_c6c = 0;
              local_c68 = 0;
              local_c64 = 0;
              local_c60 = 0;
              local_c58 = 0;
              local_c90 = 0;
              local_508 = local_888;
              local_4e8 = local_898;
              local_60 = local_138;
              local_54 = local_12c;
              local_50 = local_128;
              local_40 = local_110;
              local_3c = local_10c;
              local_c78 = local_138;
              local_c50 = local_48;
              local_c40 = local_128;
              local_c38 = local_12c;
              local_c30 = local_138;
              local_c24 = local_10c;
              local_c20 = local_110;
              local_bc0 = local_18;
              if (local_940 == 1) {
                copy_cut_border_image<signed_char>
                          (in_stack_fffffffffffff108,
                           (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                           in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
              }
              if (local_940 == 2) {
                copy_cut_border_image<unsigned_short>
                          (in_stack_fffffffffffff108,
                           (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                           in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
              }
              if (local_940 == 4) {
                copy_cut_border_image<float>
                          (in_stack_fffffffffffff108,
                           (Mat *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                           in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8);
              }
              local_878 = &local_c50;
              local_528 = local_878;
              if (local_c48 != (int *)0x0) {
                local_52c = 0xffffffff;
                LOCK();
                local_530 = *local_c48;
                *local_c48 = *local_c48 + -1;
                UNLOCK();
                if (local_530 == 1) {
                  if (local_c30 == (Allocator *)0x0) {
                    local_3a0 = local_c50;
                    if (local_c50 != (void *)0x0) {
                      free(local_c50);
                    }
                  }
                  else {
                    (*local_c30->_vptr_Allocator[3])(local_c30,local_c50);
                  }
                }
              }
              local_c50 = (void *)0x0;
              local_c40 = 0;
              local_c38 = 0;
              local_c28 = 0;
              local_c24 = 0;
              local_c20 = 0;
              local_c1c = 0;
              local_c18 = 0;
              local_c10 = 0;
              local_c48 = (int *)0x0;
              local_868 = &local_bc0;
              local_548 = local_868;
              if (local_bb8 != (int *)0x0) {
                local_54c = 0xffffffff;
                LOCK();
                local_550 = *local_bb8;
                *local_bb8 = *local_bb8 + -1;
                UNLOCK();
                if (local_550 == 1) {
                  if (local_ba0 == (Allocator *)0x0) {
                    local_390 = local_bc0;
                    if (local_bc0 != (void *)0x0) {
                      free(local_bc0);
                    }
                  }
                  else {
                    (*local_ba0->_vptr_Allocator[3])(local_ba0,local_bc0);
                  }
                }
              }
              local_bc0 = (void *)0x0;
              local_bb0 = 0;
              local_ba8 = 0;
              local_b98 = 0;
              local_b94 = 0;
              local_b90 = 0;
              local_b8c = 0;
              local_b88 = 0;
              local_b80 = 0;
              local_bb8 = (int *)0x0;
            }
          }
          local_8fc = 0;
        }
      }
      local_a4c = 1;
      ppvVar3 = &local_b28;
      if (local_b20 != (int *)0x0) {
        local_56c = 0xffffffff;
        LOCK();
        local_570 = *local_b20;
        *local_b20 = *local_b20 + -1;
        UNLOCK();
        if (local_570 == 1) {
          local_858 = ppvVar3;
          local_568 = ppvVar3;
          if (local_b08 == (Allocator *)0x0) {
            local_380 = local_b28;
            if (local_b28 != (void *)0x0) {
              free(local_b28);
            }
          }
          else {
            (*local_b08->_vptr_Allocator[3])(local_b08,local_b28);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      ppvVar3[2] = (void *)0x0;
      *(undefined4 *)(ppvVar3 + 3) = 0;
      *(undefined4 *)(ppvVar3 + 5) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
      *(undefined4 *)(ppvVar3 + 6) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
      *(undefined4 *)(ppvVar3 + 7) = 0;
      ppvVar3[8] = (void *)0x0;
      ppvVar3[1] = (void *)0x0;
    }
  }
  else {
    local_8fc = 0;
  }
  return local_8fc;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}